

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O1

Expression * __thiscall GetTupleElement::visit_intrinsic(GetTupleElement *this,Intrinsic *intrinsic)

{
  bool bVar1;
  char *pcVar2;
  Expression *pEVar3;
  StringView local_40;
  Expression *local_30;
  
  local_40.string = "reference";
  pcVar2 = StringView::strchr("reference",0);
  local_40.length = (size_t)(pcVar2 + -0x13a5f8);
  bVar1 = Intrinsic::name_equals(intrinsic,&local_40);
  pEVar3 = (Expression *)0x0;
  if (bVar1) {
    pEVar3 = *(intrinsic->arguments).
              super__Vector_base<const_Expression_*,_std::allocator<const_Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_40.string = (char *)&PTR_visit_int_literal_00153fd0;
    local_40.length = (size_t)this;
    (*pEVar3->_vptr_Expression[2])(pEVar3,&local_40);
    pEVar3 = local_30;
  }
  return pEVar3;
}

Assistant:

const Expression* visit_intrinsic(const Intrinsic& intrinsic) override {
		if (intrinsic.name_equals("reference")) {
			return visit(*this, intrinsic.get_arguments()[0]);
		}
		return nullptr;
	}